

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::first_real_span(basic_substring<const_char> *this)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  ulong pos;
  basic_substring<const_char> bVar4;
  csubstr word;
  csubstr word_00;
  basic_substring<const_char> ne;
  basic_substring<const_char> local_18;
  
  local_18 = first_non_empty_span(this);
  pcVar3 = local_18.str;
  if (pcVar3 == (char *)0x0 || local_18.len == 0) {
    return local_18;
  }
  pos = (ulong)((*pcVar3 - 0x2bU & 0xfd) == 0);
  if (pos + 3 <= local_18.len) {
    cVar1 = pcVar3[pos];
    if (cVar1 != '0') {
      if (cVar1 == 'n') {
        pcVar3 = "an";
      }
      else {
        if (cVar1 != 'i') goto LAB_001b4e49;
        word.len = 7;
        word.str = "nfinity";
        bVar4 = _word_follows(&local_18,pos + 1,word);
        if (bVar4.len != 0) {
          return bVar4;
        }
        pcVar3 = "nf";
      }
      word_00.len = 2;
      word_00.str = pcVar3;
      bVar4 = _word_follows(&local_18,pos + 1,word_00);
      return bVar4;
    }
    bVar2 = pcVar3[pos + 1] & 0xdf;
    if (bVar2 == 0x42) {
      bVar4 = _first_real_span_bin(&local_18,pos | 2);
      return bVar4;
    }
    if (bVar2 == 0x4f) {
      bVar4 = _first_real_span_oct(&local_18,pos | 2);
      return bVar4;
    }
    if (bVar2 == 0x58) {
      bVar4 = _first_real_span_hex(&local_18,pos | 2);
      return bVar4;
    }
  }
LAB_001b4e49:
  bVar4 = _first_real_span_dec(&local_18,pos);
  return bVar4;
}

Assistant:

basic_substring first_real_span() const
    {
        basic_substring ne = first_non_empty_span();
        if(ne.empty())
            return ne;
        size_t skip_start = (ne.str[0] == '+' || ne.str[0] == '-');
        C4_ASSERT(skip_start == 0 || skip_start == 1);
        // if we have at least three digits after the leading sign, it
        // can be decimal, or hex, or bin or oct. Ex:
        // non-decimal: 0x0, 0b0, 0o0
        // decimal: 1.0, 10., 1e1, 100, inf, nan, infinity
        if(ne.len >= skip_start+3)
        {
            // if it does not have leading 0, it must be decimal, or it is not a real
            if(ne.str[skip_start] != '0')
            {
                if(ne.str[skip_start] == 'i') // is it infinity or inf?
                {
                    basic_substring word = ne._word_follows(skip_start + 1, "nfinity");
                    if(word.len)
                        return word;
                    return ne._word_follows(skip_start + 1, "nf");
                }
                else if(ne.str[skip_start] == 'n') // is it nan?
                {
                    return ne._word_follows(skip_start + 1, "an");
                }
                else // must be a decimal, or it is not a real
                {
                    return ne._first_real_span_dec(skip_start);
                }
            }
            else // starts with 0. is it 0x, 0b or 0o?
            {
                const char next = ne.str[skip_start + 1];
                // hexadecimal
                if(next == 'x' || next == 'X')
                    return ne._first_real_span_hex(skip_start + 2);
                // binary
                else if(next == 'b' || next == 'B')
                    return ne._first_real_span_bin(skip_start + 2);
                // octal
                else if(next == 'o' || next == 'O')
                    return ne._first_real_span_oct(skip_start + 2);
                // none of the above. may still be a decimal.
                else
                    return ne._first_real_span_dec(skip_start); // do not skip the 0.
            }
        }
        // less than 3 chars after the leading sign. It is either a
        // decimal or it is not a real. (cannot be any of 0x0, etc).
        return ne._first_real_span_dec(skip_start);
    }